

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O2

int archive_compressor_zstd_options(archive_write_filter *f,char *key,char *value)

{
  undefined4 *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  intmax_t in_RAX;
  long lVar5;
  ZSTD_bounds ZVar6;
  intmax_t long_distance;
  
  puVar1 = (undefined4 *)f->data;
  long_distance = in_RAX;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    iVar2 = string_to_number(value,&long_distance);
    if (iVar2 != 0) {
      return -0x14;
    }
    iVar2 = ZSTD_maxCLevel();
    uVar4 = ZSTD_versionNumber();
    if (uVar4 < 0x2842) {
      uVar4 = ZSTD_versionNumber();
      lVar5 = -99;
      if (uVar4 < 0x2840) {
        lVar5 = 0;
      }
    }
    else {
      iVar3 = ZSTD_minCLevel();
      lVar5 = (long)iVar3;
    }
    if (long_distance < lVar5) {
      return -0x14;
    }
    if (iVar2 < long_distance) {
      return -0x14;
    }
    *puVar1 = (int)long_distance;
  }
  else {
    iVar2 = strcmp(key,"threads");
    if (iVar2 == 0) {
      iVar2 = string_to_number(value,&long_distance);
      if (iVar2 != 0) {
        return -0x14;
      }
      if (long_distance < 0) {
        return -0x14;
      }
      puVar1[1] = (int)long_distance;
    }
    else {
      iVar2 = strcmp(key,"frame-per-file");
      if (iVar2 == 0) {
        puVar1[4] = 1;
      }
      else {
        iVar2 = strcmp(key,"min-frame-size");
        if (iVar2 == 0) {
          iVar2 = string_to_number(value,&long_distance);
          if (iVar2 != 0) {
            return -0x14;
          }
          if (long_distance < 0) {
            return -0x14;
          }
          *(intmax_t *)(puVar1 + 6) = long_distance;
        }
        else {
          iVar2 = strcmp(key,"max-frame-size");
          if (iVar2 == 0) {
            iVar2 = string_to_number(value,&long_distance);
            if (iVar2 != 0) {
              return -0x14;
            }
            if (long_distance < 0x400) {
              return -0x14;
            }
            *(intmax_t *)(puVar1 + 8) = long_distance;
          }
          else {
            iVar2 = strcmp(key,"long");
            if (iVar2 != 0) {
              return -0x14;
            }
            iVar2 = string_to_number(value,&long_distance);
            if (iVar2 != 0) {
              return -0x14;
            }
            ZVar6 = ZSTD_cParam_getBounds(ZSTD_c_windowLog);
            uVar4 = ZSTD_isError(ZVar6.error);
            if (uVar4 == 0) {
              if (ZVar6.upperBound < (int)long_distance || (int)long_distance < ZVar6.lowerBound) {
                return -0x14;
              }
            }
            else if ((int)long_distance - 0x20U < 0xffffffea) {
              return -0x14;
            }
            puVar1[2] = (int)long_distance;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
archive_compressor_zstd_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		intmax_t level;
		if (string_to_number(value, &level) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		/* If we don't have the library, hard-code the max level */
		int minimum = CLEVEL_MIN;
		int maximum = CLEVEL_MAX;
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR
		maximum = ZSTD_maxCLevel();
#if ZSTD_VERSION_NUMBER >= MINVER_MINCLEVEL
		if (ZSTD_versionNumber() >= MINVER_MINCLEVEL) {
			minimum = ZSTD_minCLevel();
		}
		else
#endif
		if (ZSTD_versionNumber() < MINVER_NEGCLEVEL) {
			minimum = CLEVEL_STD_MIN;
		}
#endif
		if (level < minimum || level > maximum) {
			return (ARCHIVE_WARN);
		}
		data->compression_level = (int)level;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		intmax_t threads;
		if (string_to_number(value, &threads) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		if (threads < 0) {
			return (ARCHIVE_WARN);
		}
		data->threads = (int)threads;
		return (ARCHIVE_OK);
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR
	} else if (strcmp(key, "frame-per-file") == 0) {
		data->frame_per_file = 1;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "min-frame-size") == 0) {
		intmax_t min_frame_size;
		if (string_to_number(value, &min_frame_size) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		if (min_frame_size < 0) {
			return (ARCHIVE_WARN);
		}
		data->min_frame_size = min_frame_size;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "max-frame-size") == 0) {
		intmax_t max_frame_size;
		if (string_to_number(value, &max_frame_size) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		if (max_frame_size < 1024) {
			return (ARCHIVE_WARN);
		}
		data->max_frame_size = max_frame_size;
		return (ARCHIVE_OK);
#endif
	}
	else if (strcmp(key, "long") == 0) {
		intmax_t long_distance;
		if (string_to_number(value, &long_distance) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
#if HAVE_ZSTD_H && HAVE_LIBZSTD_COMPRESSOR && ZSTD_VERSION_NUMBER >= MINVER_LONG
		ZSTD_bounds bounds = ZSTD_cParam_getBounds(ZSTD_c_windowLog);
		if (ZSTD_isError(bounds.error)) {
			int max_distance = ((int)(sizeof(size_t) == 4 ? 30 : 31));
			if (((int)long_distance) < 10 || (int)long_distance > max_distance)
				return (ARCHIVE_WARN);
		} else {
			if ((int)long_distance < bounds.lowerBound || (int)long_distance > bounds.upperBound)
				return (ARCHIVE_WARN);
		}
#else
		int max_distance = ((int)(sizeof(size_t) == 4 ? 30 : 31));
		if (((int)long_distance) < 10 || (int)long_distance > max_distance)
		    return (ARCHIVE_WARN);
#endif
		data->long_distance = (int)long_distance;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}